

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool VW::is_ring_example(vw *all,example *ae)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  bool bVar4;
  
  ppVar1 = (all->p->example_pool).m_chunk_bounds.
           super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (all->p->example_pool).m_chunk_bounds.
           super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = ppVar1 != ppVar2;
  if ((bVar4) && ((ae < ppVar1->first || (ppVar1->second < ae)))) {
    ppVar1 = ppVar1 + 1;
    do {
      ppVar3 = ppVar1;
      bVar4 = ppVar3 != ppVar2;
      if (ppVar3 == ppVar2) {
        return bVar4;
      }
      ppVar1 = ppVar3 + 1;
    } while ((ae < ppVar3->first) || (ppVar3->second < ae));
  }
  return bVar4;
}

Assistant:

bool is_ring_example(vw& all, example* ae) { return all.p->example_pool.is_from_pool(ae); }